

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

ChLoad<chrono::ChLoaderGravity> * __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::Clone(ChLoad<chrono::ChLoaderGravity> *this)

{
  ChLoad<chrono::ChLoaderGravity> *this_00;
  
  this_00 = (ChLoad<chrono::ChLoaderGravity> *)::operator_new(0x88);
  ChLoad(this_00,this);
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }